

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O0

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateF32ArrHelper
          (BuiltInsValidator *this,Decoration *decoration,Instruction *inst,uint32_t num_components,
          function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *diag,uint32_t underlying_type)

{
  ValidationState_t *this_00;
  function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *pfVar1;
  bool bVar2;
  Op OVar3;
  uint32_t uVar4;
  ostream *poVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  string local_430;
  ostringstream local_410 [8];
  ostringstream ss_1;
  uint64_t local_298;
  uint64_t actual_num_components;
  string local_270;
  ostringstream local_250 [8];
  ostringstream ss;
  undefined1 local_d0 [4];
  uint32_t bit_width;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  uint32_t local_8c;
  undefined1 local_88 [4];
  uint32_t component_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  Instruction *local_48;
  Instruction *type_inst;
  function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *pfStack_38;
  uint32_t underlying_type_local;
  function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *diag_local;
  Instruction *pIStack_28;
  uint32_t num_components_local;
  Instruction *inst_local;
  Decoration *decoration_local;
  BuiltInsValidator *this_local;
  
  type_inst._4_4_ = underlying_type;
  pfStack_38 = diag;
  diag_local._4_4_ = num_components;
  pIStack_28 = inst;
  inst_local = (Instruction *)decoration;
  decoration_local = (Decoration *)this;
  local_48 = ValidationState_t::FindDef(this->_,underlying_type);
  OVar3 = val::Instruction::opcode(local_48);
  pfVar1 = pfStack_38;
  if (OVar3 == OpTypeArray) {
    local_8c = val::Instruction::word(local_48,2);
    bVar2 = ValidationState_t::IsFloatScalarType(this->_,local_8c);
    pfVar1 = pfStack_38;
    if (bVar2) {
      uVar4 = ValidationState_t::GetBitWidth(this->_,local_8c);
      if (uVar4 == 0x20) {
        if (diag_local._4_4_ != 0) {
          local_298 = 0;
          this_00 = this->_;
          uVar4 = val::Instruction::word(local_48,3);
          bVar2 = ValidationState_t::EvalConstantValUint64(this_00,uVar4,&local_298);
          if (!bVar2) {
            __assert_fail("0 && \"Array type definition is corrupt\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_builtins.cpp"
                          ,0x48c,
                          "spv_result_t spvtools::val::(anonymous namespace)::BuiltInsValidator::ValidateF32ArrHelper(const Decoration &, const Instruction &, uint32_t, const std::function<spv_result_t (const std::string &)> &, uint32_t)"
                         );
          }
          if (local_298 != diag_local._4_4_) {
            std::__cxx11::ostringstream::ostringstream(local_410);
            (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
                      (&local_430,this,(Decoration *)inst_local,pIStack_28);
            poVar5 = std::operator<<((ostream *)local_410,(string *)&local_430);
            poVar5 = std::operator<<(poVar5," has ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_298);
            std::operator<<(poVar5," components.");
            std::__cxx11::string::~string((string *)&local_430);
            pfVar1 = pfStack_38;
            std::__cxx11::ostringstream::str();
            this_local._4_4_ =
                 std::
                 function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                 ::operator()(pfVar1,&local_450);
            std::__cxx11::string::~string((string *)&local_450);
            std::__cxx11::ostringstream::~ostringstream(local_410);
            return this_local._4_4_;
          }
        }
        this_local._4_4_ = SPV_SUCCESS;
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_250);
        (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
                  (&local_270,this,(Decoration *)inst_local,pIStack_28);
        poVar5 = std::operator<<((ostream *)local_250,(string *)&local_270);
        poVar5 = std::operator<<(poVar5," has components with bit width ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar4);
        std::operator<<(poVar5,".");
        std::__cxx11::string::~string((string *)&local_270);
        pfVar1 = pfStack_38;
        std::__cxx11::ostringstream::str();
        this_local._4_4_ =
             std::
             function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             ::operator()(pfVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&actual_num_components);
        std::__cxx11::string::~string((string *)&actual_num_components);
        std::__cxx11::ostringstream::~ostringstream(local_250);
      }
    }
    else {
      (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
                ((string *)local_d0,this,(Decoration *)inst_local,pIStack_28);
      std::operator+(&local_b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     " components are not float scalar.");
      this_local._4_4_ =
           std::
           function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           ::operator()(pfVar1,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)local_d0);
    }
  }
  else {
    (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
              ((string *)local_88,this,(Decoration *)inst_local,pIStack_28);
    std::operator+(&local_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                   " is not an array.");
    this_local._4_4_ =
         std::
         function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
         ::operator()(pfVar1,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)local_88);
  }
  return this_local._4_4_;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateF32ArrHelper(
    const Decoration& decoration, const Instruction& inst,
    uint32_t num_components,
    const std::function<spv_result_t(const std::string& message)>& diag,
    uint32_t underlying_type) {
  const Instruction* const type_inst = _.FindDef(underlying_type);
  if (type_inst->opcode() != spv::Op::OpTypeArray) {
    return diag(GetDefinitionDesc(decoration, inst) + " is not an array.");
  }

  const uint32_t component_type = type_inst->word(2);
  if (!_.IsFloatScalarType(component_type)) {
    return diag(GetDefinitionDesc(decoration, inst) +
                " components are not float scalar.");
  }

  const uint32_t bit_width = _.GetBitWidth(component_type);
  if (bit_width != 32) {
    std::ostringstream ss;
    ss << GetDefinitionDesc(decoration, inst)
       << " has components with bit width " << bit_width << ".";
    return diag(ss.str());
  }

  if (num_components != 0) {
    uint64_t actual_num_components = 0;
    if (!_.EvalConstantValUint64(type_inst->word(3), &actual_num_components)) {
      assert(0 && "Array type definition is corrupt");
    }
    if (actual_num_components != num_components) {
      std::ostringstream ss;
      ss << GetDefinitionDesc(decoration, inst) << " has "
         << actual_num_components << " components.";
      return diag(ss.str());
    }
  }

  return SPV_SUCCESS;
}